

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initializeGlobalVars.cpp
# Opt level: O0

void initializeGlobalVars(Module *module,Program *program)

{
  bool bVar1;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>
  this;
  ret_type pGVar2;
  Expr *pEVar3;
  GlobalValue *var;
  RefExpr *ref;
  GlobalVariable *gvar;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>
  __end1;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>
  __begin1;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>_>
  *__range1;
  Program *in_stack_00000730;
  Value *in_stack_00000738;
  RefExpr *in_stack_ffffffffffffffb0;
  Program *in_stack_ffffffffffffffb8;
  PassType pass;
  Program *in_stack_ffffffffffffffc0;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>
  local_30;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>_>
  local_28;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>_>
  *local_18;
  
  local_28 = llvm::Module::globals((Module *)in_stack_ffffffffffffffc0);
  local_18 = &local_28;
  local_30 = llvm::
             iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>_>
             ::begin(local_18);
  this = llvm::
         iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>_>
         ::end(local_18);
  while( true ) {
    pass = (PassType)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    bVar1 = llvm::operator!=(&local_30,
                             (ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>
                              *)&stack0xffffffffffffffc8);
    if (!bVar1) break;
    in_stack_ffffffffffffffb8 =
         (Program *)
         llvm::
         ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>
         ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>
                      *)0x2913cc);
    in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffb8;
    bVar1 = llvm::isa<llvm::Function,llvm::GlobalVariable_const*>((GlobalVariable **)0x2913e5);
    if ((!bVar1) &&
       (bVar1 = llvm::GlobalVariable::hasInitializer((GlobalVariable *)0x2913f7), bVar1)) {
      in_stack_ffffffffffffffb0 =
           Program::getGlobalVar((Program *)this.NodePtr,(Value *)in_stack_ffffffffffffffc0);
      pGVar2 = llvm::cast<GlobalValue,Expr>((Expr *)0x29141f);
      llvm::GlobalVariable::getInitializer((GlobalVariable *)0x29142d);
      pEVar3 = createConstantValue(in_stack_00000738,in_stack_00000730);
      pGVar2->value = pEVar3;
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_true>
                  *)in_stack_ffffffffffffffb0);
  }
  Program::addPass(in_stack_ffffffffffffffc0,pass);
  return;
}

Assistant:

void initializeGlobalVars(const llvm::Module* module, Program& program) {
    assert(program.isPassCompleted(PassType::CreateConstants));
    assert(program.isPassCompleted(PassType::ComputeGlobalVarsOrder));

    for (const llvm::GlobalVariable& gvar : module->globals()) {
        if (llvm::isa<llvm::Function>(&gvar)) {
            continue;
        }

        if (gvar.hasInitializer()) {
            auto* ref = program.getGlobalVar(&gvar);
            auto* var = llvm::cast<GlobalValue>(ref->expr);
            var->value = createConstantValue(gvar.getInitializer(), program);
        }
    }

    program.addPass(PassType::InitializeGlobalVars);
}